

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingGraph.cpp
# Opt level: O0

void __thiscall ProblemFireFightingGraph::SetYScopes(ProblemFireFightingGraph *this)

{
  MultiAgentDecisionProcessDiscreteFactoredStates *this_00;
  MultiAgentDecisionProcessDiscreteFactoredStates *pMVar1;
  long *in_RDI;
  Scope a;
  Scope x;
  Index yI;
  Index agI;
  Scope allAgents;
  undefined4 in_stack_ffffffffffffff28;
  Index in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  Index y;
  allocator<char> local_a1;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  uint local_38;
  uint local_24;
  
  Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_24 = 0;
  while( true ) {
    this_00 = (MultiAgentDecisionProcessDiscreteFactoredStates *)(ulong)local_24;
    pMVar1 = (MultiAgentDecisionProcessDiscreteFactoredStates *)(**(code **)(*in_RDI + 0x10))();
    if (pMVar1 <= this_00) break;
    Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
    local_24 = local_24 + 1;
  }
  for (local_38 = 0; (ulong)local_38 < (ulong)in_RDI[0xe2]; local_38 = local_38 + 1) {
    Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    Scope::Scope((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (local_38 != 0) {
      Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
      Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
    }
    Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
    if ((ulong)local_38 < in_RDI[0xe2] - 1U) {
      Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
      Scope::Insert((Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
    }
    y = (Index)((ulong)&local_a1 >> 0x20);
    in_stack_ffffffffffffff34 = local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    Scope::Scope((Scope *)this,
                 (string *)
                 allAgents.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    MultiAgentDecisionProcessDiscreteFactoredStates::SetSoI_Y
              (this_00,y,(Scope *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (Scope *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (Scope *)0x9a3cc4);
    Scope::~Scope((Scope *)0x9a3cd0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
    std::allocator<char>::~allocator(&local_a1);
    Scope::~Scope((Scope *)0x9a3cee);
    Scope::~Scope((Scope *)0x9a3cfb);
  }
  Scope::~Scope((Scope *)0x9a3d95);
  return;
}

Assistant:

void ProblemFireFightingGraph::SetYScopes()
{    
//specify connections for the 2DBN
#if DEBUG_PFFF
    cout << "About to set the SoIs for all next-stage(NS) SFs Y..."<<endl;
#endif
    Scope allAgents;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        allAgents.Insert(agI);

    for(Index yI=0; yI < _m_nrHouses; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        Scope a;
        if(yI > 0)
        {
            x.Insert(yI-1);
            a.Insert(yI-1);
        }
        x.Insert(yI); // firelevel of house yI influenced by its PS firelevel
        if(yI < (_m_nrHouses-1) )
        {
            x.Insert(yI+1);
            a.Insert(yI);
        }

        SetSoI_Y( yI, //sfacI = 0 -> house 0
                  x,
                  a,
                  //allAgents,
                  Scope("<>") // no interdependencies between next-stage FLs
                );
    }
}